

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evol.c
# Opt level: O0

int IO_field_type_eq(char *str1,char *str2)

{
  FMdata_type FVar1;
  FMdata_type FVar2;
  int iVar3;
  char *__s;
  char *__s_00;
  char *pcVar4;
  char *pcVar5;
  char *__s1;
  char *__s2;
  char *in_RSI;
  char *in_RDI;
  intptr_t count2;
  intptr_t count1;
  char *lparen2;
  char *lparen1;
  char *colon2;
  char *colon1;
  char *tmp_str2;
  char *tmp_str1;
  long t2_count;
  long t1_count;
  FMdata_type t2;
  FMdata_type t1;
  long *in_stack_000003a0;
  char *in_stack_000003a8;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  size_t local_88;
  size_t local_70;
  size_t local_68;
  long local_30;
  long local_28;
  uint local_4;
  
  FVar1 = FMarray_str_to_data_type(in_stack_000003a8,in_stack_000003a0);
  FVar2 = FMarray_str_to_data_type(in_stack_000003a8,in_stack_000003a0);
  if ((local_28 == -1) && (local_30 == -1)) {
    __s = base_data_type((char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    __s_00 = base_data_type((char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    pcVar4 = strchr(__s,0x3a);
    pcVar5 = strchr(__s_00,0x3a);
    __s1 = strchr(in_RDI,0x5b);
    __s2 = strchr(in_RSI,0x5b);
    if (pcVar4 == (char *)0x0) {
      local_68 = strlen(__s);
    }
    else {
      local_68 = (long)pcVar4 - (long)__s;
    }
    if (pcVar5 == (char *)0x0) {
      local_70 = strlen(__s_00);
    }
    else {
      local_70 = (long)pcVar5 - (long)__s_00;
    }
    if ((long)local_70 < (long)local_68) {
      local_88 = local_68;
    }
    else {
      local_88 = local_70;
    }
    iVar3 = strncmp(__s,__s_00,local_88);
    if (iVar3 == 0) {
      free(__s);
      free(__s_00);
      if ((__s1 == (char *)0x0) || (__s2 == (char *)0x0)) {
        local_4 = 0xffffffff;
      }
      else {
        iVar3 = strcmp(__s1,__s2);
        local_4 = (uint)(iVar3 == 0);
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = (uint)(FVar1 == FVar2 && local_28 == local_30);
  }
  return local_4;
}

Assistant:

static int
IO_field_type_eq(const char *str1, const char *str2)
{
    FMdata_type t1, t2;
    long t1_count, t2_count;

    t1 = FMarray_str_to_data_type(str1, &t1_count);
    t2 = FMarray_str_to_data_type(str2, &t2_count);

    if ((t1_count == -1) && (t2_count == -1)) {
	/* variant array */
	char *tmp_str1 = base_data_type(str1);
	char *tmp_str2 = base_data_type(str2);
	
	char *colon1 = strchr(tmp_str1, ':');
	char *colon2 = strchr(tmp_str2, ':');
	char *lparen1 = strchr(str1, '[');
	char *lparen2 = strchr(str2, '[');
	intptr_t count1 = 0;
	intptr_t count2 = 0;

	if (colon1 != NULL) {
	    count1 = colon1 - tmp_str1;
	} else {
	    count1 = strlen(tmp_str1);
	}
	if (colon2 != NULL) {
	    count2 = colon2 - tmp_str2;
	} else {
	    count2 = strlen(tmp_str2);
	}
	/*compare base type */
	if (strncmp(tmp_str1, tmp_str2,(count1>count2)?count1:count2) != 0) {
	    /* base types differ */
	    return 0;
	}
	free(tmp_str1);
	free(tmp_str2);
	if ((lparen1 == NULL) || (lparen2 == NULL)) return -1;
	return (strcmp(lparen1, lparen2) == 0);
    }
    return ((t1 == t2) && (t1_count == t2_count));
}